

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<NoCopy> * __thiscall
kj::_::ExceptionOr<NoCopy>::operator=(ExceptionOr<NoCopy> *this,ExceptionOr<NoCopy> *param_1)

{
  ExceptionOr<NoCopy> *param_1_local;
  ExceptionOr<NoCopy> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<NoCopy>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;